

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

void cleanup_curse(void)

{
  int local_c;
  wchar_t idx;
  
  for (local_c = 0; local_c < (int)(uint)z_info->curse_max; local_c = local_c + 1) {
    string_free(curses[local_c].name);
    string_free(curses[local_c].conflict);
    mem_free(curses[local_c].desc);
    if (curses[local_c].obj != (object *)0x0) {
      free_effect((curses[local_c].obj)->effect);
      mem_free((curses[local_c].obj)->effect_msg);
      if ((curses[local_c].obj)->known != (object *)0x0) {
        object_free((curses[local_c].obj)->known);
      }
      mem_free(curses[local_c].obj);
    }
    mem_free(curses[local_c].poss);
  }
  mem_free(curses);
  return;
}

Assistant:

static void cleanup_curse(void)
{
	int idx;
	for (idx = 0; idx < z_info->curse_max; idx++) {
		string_free(curses[idx].name);
		string_free(curses[idx].conflict);
		mem_free(curses[idx].desc);
		if (curses[idx].obj) {
			free_effect(curses[idx].obj->effect);
			mem_free(curses[idx].obj->effect_msg);
			if (curses[idx].obj->known) {
				object_free(curses[idx].obj->known);
			}
			mem_free(curses[idx].obj);
		}
		mem_free(curses[idx].poss);
	}
	mem_free(curses);
}